

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O2

pair<Polynom<Rational>,_Polynom<Rational>_> * __thiscall
Polynom<Rational>::ordinalDiv
          (pair<Polynom<Rational>,_Polynom<Rational>_> *__return_storage_ptr__,
          Polynom<Rational> *this,Polynom<Rational> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  compare_t cVar4;
  ulong uVar5;
  matrix_error *this_00;
  BigInteger *this_01;
  Matrix<Rational> *this_02;
  Matrix<Rational> m;
  BigInteger l;
  Polynom<Rational> res_1;
  BigInteger r;
  Polynom<Rational> rem;
  Polynom<Rational> res;
  Matrix<Rational> local_60;
  BigInteger local_50;
  
  bVar1 = isOrdinal(this);
  if ((!bVar1) || (bVar1 = isOrdinal(a), !bVar1)) {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Invalid ordinal");
LAB_0013051d:
    __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = degree(a);
  if (iVar2 < 0) {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Ordinal division by zero");
    goto LAB_0013051d;
  }
  iVar2 = degree(this);
  if ((iVar2 < 0) || (iVar3 = degree(a), iVar2 < iVar3)) {
    Polynom(&rem);
    std::pair<Polynom<Rational>,_Polynom<Rational>_>::pair<Polynom<Rational>,_true>
              (__return_storage_ptr__,&rem,this);
    this_02 = &rem.m;
    goto LAB_00130436;
  }
  Matrix<Rational>::Matrix(&m,1,iVar2 + 1U);
  for (uVar5 = 0; uVar5 != iVar2 + 1U; uVar5 = uVar5 + 1) {
    BigInteger::BigInteger(&l,0);
    BigInteger::BigInteger(&r,1);
    while( true ) {
      BigInteger::BigInteger((BigInteger *)&res_1,1);
      ::operator-((BigInteger *)&res,&r,(BigInteger *)&res_1);
      Rational::Rational((Rational *)&rem,(BigInteger *)&res);
      Rational::operator=(m.arr + uVar5,(Rational *)&rem);
      Rational::~Rational((Rational *)&rem);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&res);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&res_1);
      Polynom(&rem,&m);
      ordinalMul(&res,a);
      cVar4 = ordinalCmp(this,&res);
      if (cVar4 == CMP_LESS) break;
      if (cVar4 == CMP_EQUAL) {
        Polynom(&res_1);
        std::pair<Polynom<Rational>,_Polynom<Rational>_>::
        pair<Polynom<Rational>_&,_Polynom<Rational>,_true>(__return_storage_ptr__,&rem,&res_1);
        Matrix<Rational>::~Matrix(&res_1.m);
        Matrix<Rational>::~Matrix(&res.m);
        Matrix<Rational>::~Matrix(&rem.m);
        goto LAB_00130415;
      }
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&res);
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&rem);
      BigInteger::BigInteger(&local_50,2);
      BigInteger::operator*=(&r,&local_50);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
    }
    Matrix<Rational>::~Matrix((Matrix<Rational> *)&res);
    Matrix<Rational>::~Matrix((Matrix<Rational> *)&rem);
    while( true ) {
      BigInteger::BigInteger((BigInteger *)&res,1);
      ::operator+((BigInteger *)&rem,&l,(BigInteger *)&res);
      bVar1 = operator<((BigInteger *)&rem,&r);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&rem);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&res);
      if (!bVar1) break;
      ::operator+((BigInteger *)&rem,&l,&r);
      BigInteger::BigInteger((BigInteger *)&res_1,2);
      ::operator/((BigInteger *)&res,(BigInteger *)&rem,(BigInteger *)&res_1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&res_1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&rem);
      Rational::Rational((Rational *)&rem,(BigInteger *)&res);
      Rational::operator=(m.arr + uVar5,(Rational *)&rem);
      Rational::~Rational((Rational *)&rem);
      Polynom(&rem,&m);
      ordinalMul(&res_1,a);
      cVar4 = ordinalCmp(this,&res_1);
      if (cVar4 == CMP_EQUAL) {
        Polynom((Polynom<Rational> *)&local_60);
        std::pair<Polynom<Rational>,_Polynom<Rational>_>::
        pair<Polynom<Rational>_&,_Polynom<Rational>,_true>
                  (__return_storage_ptr__,&rem,(Polynom<Rational> *)&local_60);
        Matrix<Rational>::~Matrix(&local_60);
      }
      else {
        this_01 = &l;
        if (cVar4 == CMP_LESS) {
          this_01 = &r;
        }
        BigInteger::operator=(this_01,(BigInteger *)&res);
      }
      Matrix<Rational>::~Matrix(&res_1.m);
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&rem);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&res);
      if (cVar4 == CMP_EQUAL) goto LAB_00130415;
    }
    Rational::Rational((Rational *)&rem,&l);
    Rational::operator=(m.arr + uVar5,(Rational *)&rem);
    Rational::~Rational((Rational *)&rem);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&r);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&l);
  }
  Polynom((Polynom<Rational> *)&r,&m);
  ordinalMul((Polynom<Rational> *)&l,a);
  ordinalSub(&rem,this);
  Matrix<Rational>::~Matrix((Matrix<Rational> *)&l);
  Matrix<Rational>::~Matrix((Matrix<Rational> *)&r);
  Polynom((Polynom<Rational> *)&l,&m);
  std::pair<Polynom<Rational>,_Polynom<Rational>_>::
  pair<Polynom<Rational>,_Polynom<Rational>_&,_true>
            (__return_storage_ptr__,(Polynom<Rational> *)&l,&rem);
  Matrix<Rational>::~Matrix((Matrix<Rational> *)&l);
  Matrix<Rational>::~Matrix(&rem.m);
LAB_00130431:
  this_02 = &m;
LAB_00130436:
  Matrix<Rational>::~Matrix(this_02);
  return __return_storage_ptr__;
LAB_00130415:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&r);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&l);
  goto LAB_00130431;
}

Assistant:

const std::pair<Polynom<Field>, Polynom<Field>> Polynom<Field>::ordinalDiv(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    if(a.degree() < 0)
        throw matrix_error("Ordinal division by zero");
    int d = degree();
    if(d < 0 || d < a.degree())
        return {Polynom(), *this};
    Matrix<Field> m(1, d + 1);
    for(int coeff = 0; coeff < d + 1; ++coeff)
    {
        BigInteger l = 0, r = 1;
        for(;; r *= 2)
        {
            m[0][coeff] = r - 1;
            Polynom t(m);
            Polynom res = a.ordinalMul(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return {t, Polynom()};
            if(cmp == CMP_LESS)
                break;
        }
        while(l + 1 < r)
        {
            BigInteger mid = (l + r) / 2;
            m[0][coeff] = mid;
            Polynom t(m);
            Polynom res = a.ordinalMul(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return {t, Polynom()};
            if(cmp == CMP_LESS)
                r = mid;
            else
                l = mid;
        }
        m[0][coeff] = l;
    }
    Polynom rem = ordinalSub(a.ordinalMul(Polynom(m)));
    return {Polynom(m), rem};
}